

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

void Abc_NtkReinsertNodes(Abc_Ntk_t *p,Abc_Ntk_t *pNtk,int iPivot)

{
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if (p->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                  ,0x180,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (p->vCis->nSize <= pNtk->vCis->nSize) {
    p_00 = Abc_NtkDfs(p,0);
    Abc_NtkCleanCopy(p);
    for (iVar6 = 0; iVar6 < p->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar1 = Abc_NtkObj(p,iVar6);
      if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
        Abc_ObjRemoveFanins(pAVar1);
        pcVar2 = Abc_SopRegister((Mem_Flex_t *)p->pManFunc," 0\n");
        (pAVar1->field_5).pData = pcVar2;
      }
    }
    for (iVar6 = 0; iVar7 = p->vCis->nSize, iVar6 < iVar7; iVar6 = iVar6 + 1) {
      pAVar1 = Abc_NtkCi(p,iVar6);
      pAVar3 = Abc_NtkCi(pNtk,iVar6);
      (pAVar3->field_6).pCopy = pAVar1;
    }
    iVar6 = p_00->nSize;
    if (iVar7 + iVar6 + p->vPos->nSize == iPivot) {
      for (iVar7 = 0; iVar7 < iVar6; iVar7 = iVar7 + 1) {
        pvVar4 = Vec_PtrEntry(p_00,iVar7);
        pAVar1 = Abc_NtkObj(pNtk,iVar7 + p->vCis->nSize + 1);
        if (pAVar1 != (Abc_Obj_t *)0x0) {
          (pAVar1->field_6).pTemp = pvVar4;
        }
        iVar6 = p_00->nSize;
      }
      iVar7 = 0;
      do {
        if (iVar6 <= iVar7) {
          Vec_PtrFree(p_00);
          return;
        }
        pvVar4 = Vec_PtrEntry(p_00,iVar7);
        iVar7 = iVar7 + 1;
        pAVar1 = Abc_NtkObj(pNtk,p->vCis->nSize + iVar7);
        if (pAVar1 != (Abc_Obj_t *)0x0) {
          if ((pAVar1->field_6).pTemp != pvVar4) {
            __assert_fail("pNodeNew->pCopy == pNode",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                          ,0x19c,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
          }
          for (lVar5 = 0; lVar5 < (pAVar1->vFanins).nSize; lVar5 = lVar5 + 1) {
            Abc_ObjAddFanin((pAVar1->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pAVar1->pNtk->vObjs->pArray[(pAVar1->vFanins).pArray[lVar5]] +
                             0x40));
          }
          pcVar2 = Abc_SopRegister((Mem_Flex_t *)p->pManFunc,(char *)(pAVar1->field_5).pData);
          *(char **)((long)pvVar4 + 0x38) = pcVar2;
        }
        iVar6 = p_00->nSize;
      } while( true );
    }
    __assert_fail("Vec_PtrSize(vNodes) + Abc_NtkCiNum(p) + Abc_NtkPoNum(p) == iPivot",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                  ,0x18e,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  __assert_fail("Abc_NtkCiNum(p) <= Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                ,0x181,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkReinsertNodes( Abc_Ntk_t * p, Abc_Ntk_t * pNtk, int iPivot )
{
    Abc_Obj_t * pNode, * pNodeNew, * pFaninNew;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( Abc_NtkIsLogic(p) );
    assert( Abc_NtkCiNum(p) <= Abc_NtkCiNum(pNtk) );
    vNodes = Abc_NtkDfs( p, 0 );
    // clean old network
    Abc_NtkCleanCopy( p );
    Abc_NtkForEachNode( p, pNode, i )
    {
        Abc_ObjRemoveFanins( pNode );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pManFunc, (char *)" 0\n" );
    }
    // map CIs
    Abc_NtkForEachCi( p, pNode, i )
        Abc_NtkCi(pNtk, i)->pCopy = pNode;
    // map internal nodes
    assert( Vec_PtrSize(vNodes) + Abc_NtkCiNum(p) + Abc_NtkPoNum(p) == iPivot );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNodeNew = Abc_NtkObj( pNtk, Abc_NtkCiNum(p) + i + 1 );
        if ( pNodeNew == NULL )
            continue;
        pNodeNew->pCopy = pNode;
    }
    // connect internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNodeNew = Abc_NtkObj( pNtk, Abc_NtkCiNum(p) + i + 1 );
        if ( pNodeNew == NULL )
            continue;
        assert( pNodeNew->pCopy == pNode );
        Abc_ObjForEachFanin( pNodeNew, pFaninNew, k )
            Abc_ObjAddFanin( pNodeNew->pCopy, pFaninNew->pCopy );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pManFunc, (char *)pNodeNew->pData );
    }
    Vec_PtrFree( vNodes );
}